

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

Range __thiscall bssl::DTLSMessageBitmap::NextUnmarkedRange(DTLSMessageBitmap *this,size_t start)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong i;
  ulong uVar6;
  size_t sVar7;
  Range RVar8;
  
  uVar6 = this->first_unmarked_byte_ << 3;
  if (uVar6 <= start) {
    uVar6 = start;
  }
  i = uVar6 >> 3;
  if (i < (this->bytes_).size_) {
    pbVar3 = Array<unsigned_char>::operator[](&this->bytes_,i);
    bVar1 = *pbVar3;
    bVar2 = BitRange(0,(ulong)((uint)uVar6 & 7));
    bVar2 = bVar2 | bVar1;
    if (bVar2 == 0xff) {
      do {
        i = i + 1;
        uVar6 = (this->bytes_).size_;
        if (uVar6 <= i) {
          bVar2 = 0xff;
          goto LAB_00167b07;
        }
        puVar4 = Array<unsigned_char>::operator[](&this->bytes_,i);
      } while (*puVar4 == 0xff);
      pbVar3 = Array<unsigned_char>::operator[](&this->bytes_,i);
      bVar2 = *pbVar3;
      uVar6 = (this->bytes_).size_;
LAB_00167b07:
      if (uVar6 <= i) goto LAB_00167b80;
    }
    RVar8 = FirstUnmarkedRangeInByte(bVar2);
    sVar5 = RVar8.end;
    if (RVar8.start == sVar5) {
      __assert_fail("!range.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x93,
                    "DTLSMessageBitmap::Range bssl::DTLSMessageBitmap::NextUnmarkedRange(size_t) const"
                   );
    }
    sVar7 = RVar8.start + i * 8;
    if (sVar5 == 8) {
      sVar5 = i * 8;
      do {
        sVar5 = sVar5 + 8;
        i = i + 1;
        uVar6 = (this->bytes_).size_;
        if (uVar6 <= i) goto LAB_00167b5e;
        puVar4 = Array<unsigned_char>::operator[](&this->bytes_,i);
      } while (*puVar4 == '\0');
      uVar6 = (this->bytes_).size_;
LAB_00167b5e:
      if (i < uVar6) {
        puVar4 = Array<unsigned_char>::operator[](&this->bytes_,i);
        RVar8 = FirstUnmarkedRangeInByte(*puVar4);
        if (RVar8.start == 0) {
          sVar5 = sVar5 + RVar8.end;
        }
      }
    }
    else {
      sVar5 = sVar5 + i * 8;
    }
  }
  else {
LAB_00167b80:
    sVar7 = 0;
    sVar5 = 0;
  }
  RVar8.end = sVar5;
  RVar8.start = sVar7;
  return RVar8;
}

Assistant:

DTLSMessageBitmap::Range DTLSMessageBitmap::NextUnmarkedRange(
    size_t start) const {
  // Don't bother looking at bytes that are known to be fully marked.
  start = std::max(start, first_unmarked_byte_ << 3);

  size_t idx = start >> 3;
  if (idx >= bytes_.size()) {
    return Range{0, 0};
  }

  // Look at the bits from |start| up to a byte boundary.
  uint8_t byte = bytes_[idx] | BitRange(0, start & 7);
  if (byte == 0xff) {
    // Nothing unmarked at this byte. Keep searching for an unmarked bit.
    for (idx = idx + 1; idx < bytes_.size(); idx++) {
      if (bytes_[idx] != 0xff) {
        byte = bytes_[idx];
        break;
      }
    }
    if (idx >= bytes_.size()) {
      return Range{0, 0};
    }
  }

  Range range = FirstUnmarkedRangeInByte(byte);
  assert(!range.empty());
  bool should_extend = range.end == 8;
  range.start += idx << 3;
  range.end += idx << 3;
  if (!should_extend) {
    // The range did not end at a byte boundary. We're done.
    return range;
  }

  // Collect all fully unmarked bytes.
  for (idx = idx + 1; idx < bytes_.size(); idx++) {
    if (bytes_[idx] != 0) {
      break;
    }
  }
  range.end = idx << 3;

  // Add any bits from the remaining byte, if any.
  if (idx < bytes_.size()) {
    Range extra = FirstUnmarkedRangeInByte(bytes_[idx]);
    if (extra.start == 0) {
      range.end += extra.end;
    }
  }

  return range;
}